

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

void __thiscall ImGuiWS::Impl::Impl(Impl *this)

{
  long in_RDI;
  XorRlePerDrawListWithVtxOffset *this_00;
  pointer __p;
  function<void_()> *this_01;
  undefined8 in_stack_ffffffffffffff98;
  Events *in_stack_ffffffffffffffa0;
  
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffffa0,
             (__integral_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  this_00 = (XorRlePerDrawListWithVtxOffset *)(in_RDI + 8);
  std::thread::thread((thread *)0x1ced8d);
  std::shared_mutex::shared_mutex((shared_mutex *)0x1ced9b);
  Data::Data((Data *)in_stack_ffffffffffffffa0);
  Data::Data((Data *)in_stack_ffffffffffffffa0);
  Events::Events(in_stack_ffffffffffffffa0);
  Incppect<false>::Incppect();
  __p = (pointer)(in_RDI + 0x218);
  std::function<void_()>::function((function<void_()> *)in_stack_ffffffffffffffa0);
  this_01 = (function<void_()> *)(in_RDI + 0x238);
  std::function<void_()>::function(this_01);
  operator_new(0x58);
  ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset(this_00);
  std::
  unique_ptr<ImDrawDataCompressor::Interface,std::default_delete<ImDrawDataCompressor::Interface>>::
  unique_ptr<std::default_delete<ImDrawDataCompressor::Interface>,void>
            ((unique_ptr<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
              *)this_01,__p);
  return;
}

Assistant:

Impl() : compressorDrawData(new ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset()) {}